

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *buf_ptr;
  ulong uVar5;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  ulong local_58 [2];
  buffer<char> local_48;
  memory_buf_t *local_28;
  
  pcVar2 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar4 = strlen(pcVar2);
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar2,pcVar2 + sVar4);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  pcVar2 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar4 = strlen(pcVar2);
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar2,pcVar2 + sVar4);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  local_48.capacity_ =
       (size_t)::fmt::v9::format_int::format_signed<int>((format_int *)&local_48,tm_time->tm_mday);
  ::fmt::v9::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,(char *)local_48.capacity_,
             (char *)((long)&local_48.size_ + 5));
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  uVar1 = tm_time->tm_hour;
  uVar5 = (ulong)uVar1;
  if (uVar5 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (byte)(uVar5 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    local_48.size_ = (dest->super_buffer<char>).size_;
    local_48._vptr_buffer = (_func_int **)&PTR_grow_001c5a78;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_58;
    args.desc_ = 1;
    local_58[0] = uVar5;
    local_48.capacity_ = local_48.size_;
    local_28 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_48,fmt,args,(locale_ref)0x0);
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ':';
  uVar1 = tm_time->tm_min;
  uVar5 = (ulong)uVar1;
  if (uVar5 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (byte)(uVar5 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    local_48.size_ = (dest->super_buffer<char>).size_;
    local_48._vptr_buffer = (_func_int **)&PTR_grow_001c5a78;
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_58;
    args_00.desc_ = 1;
    local_58[0] = uVar5;
    local_48.capacity_ = local_48.size_;
    local_28 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_48,fmt_00,args_00,(locale_ref)0x0);
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ':';
  uVar1 = tm_time->tm_sec;
  uVar5 = (ulong)uVar1;
  if (uVar5 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (byte)(uVar5 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    local_48.size_ = (dest->super_buffer<char>).size_;
    local_48._vptr_buffer = (_func_int **)&PTR_grow_001c5a78;
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_58;
    args_01.desc_ = 1;
    local_58[0] = uVar5;
    local_48.capacity_ = local_48.size_;
    local_28 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_48,fmt_01,args_01,(locale_ref)0x0);
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  local_48.capacity_ =
       (size_t)::fmt::v9::format_int::format_signed<int>
                         ((format_int *)&local_48,tm_time->tm_year + 0x76c);
  ::fmt::v9::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,(char *)local_48.capacity_,
             (char *)((long)&local_48.size_ + 5));
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }